

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# findDeclaredFunctions.cpp
# Opt level: O0

void findDeclaredFunctions(Module *module,Program *program)

{
  StringRef RHS;
  StringRef LHS;
  bool bVar1;
  LinkageTypes Linkage;
  ulong uVar2;
  undefined1 auVar3 [16];
  Function *func;
  ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_true>
  __end1;
  ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_true>
  __begin1;
  iterator_range<llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_true>_>
  *__range1;
  Program *in_stack_00000208;
  Function *in_stack_00000210;
  undefined6 in_stack_ffffffffffffff18;
  byte in_stack_ffffffffffffff1e;
  undefined1 in_stack_ffffffffffffff1f;
  undefined8 in_stack_ffffffffffffff20;
  undefined8 in_stack_ffffffffffffff28;
  undefined6 in_stack_ffffffffffffff30;
  undefined1 in_stack_ffffffffffffff36;
  undefined1 in_stack_ffffffffffffff37;
  Function *in_stack_ffffffffffffff38;
  Program *in_stack_ffffffffffffff40;
  char *in_stack_ffffffffffffff48;
  StringRef *in_stack_ffffffffffffff58;
  undefined1 auVar4 [16];
  Function local_80 [32];
  string local_60 [32];
  reference local_40;
  ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_true>
  local_38;
  ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_true>
  local_30;
  iterator_range<llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_true>_>
  local_28;
  iterator_range<llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_true>_>
  *local_18;
  
  local_28 = llvm::Module::functions
                       ((Module *)
                        CONCAT17(in_stack_ffffffffffffff37,
                                 CONCAT16(in_stack_ffffffffffffff36,in_stack_ffffffffffffff30)));
  local_18 = &local_28;
  local_30 = llvm::
             iterator_range<llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_true>_>
             ::begin(local_18);
  local_38 = llvm::
             iterator_range<llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_true>_>
             ::end(local_18);
  auVar3._8_8_ = in_stack_ffffffffffffff20;
  auVar3._0_8_ = in_stack_ffffffffffffff28;
  do {
    bVar1 = llvm::operator!=(&local_30,&local_38);
    if (!bVar1) {
      Program::addPass((Program *)
                       CONCAT17(in_stack_ffffffffffffff37,
                                CONCAT16(in_stack_ffffffffffffff36,in_stack_ffffffffffffff30)),
                       auVar3._4_4_);
      return;
    }
    local_40 = llvm::
               ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_true>
               ::operator*((ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_true>
                            *)0x28d7a9);
    bVar1 = llvm::Value::hasName((Value *)local_40);
    if (bVar1) {
      uVar2 = llvm::GlobalValue::isDeclaration();
      if ((uVar2 & 1) == 0) {
        Linkage = llvm::GlobalValue::getLinkage((GlobalValue *)local_40);
        bVar1 = llvm::GlobalValue::isInternalLinkage(Linkage);
        if (bVar1) goto LAB_0028d7f5;
      }
      else {
LAB_0028d7f5:
        llvm::Value::getName();
        in_stack_ffffffffffffff38 = local_80;
        llvm::StringRef::str_abi_cxx11_(in_stack_ffffffffffffff58);
        std::__cxx11::string::substr((ulong)local_60,(ulong)in_stack_ffffffffffffff38);
        in_stack_ffffffffffffff37 =
             std::operator!=(auVar3._8_8_,
                             (char *)CONCAT17(in_stack_ffffffffffffff1f,
                                              CONCAT16(in_stack_ffffffffffffff1e,
                                                       in_stack_ffffffffffffff18)));
        in_stack_ffffffffffffff1e = false;
        if ((bool)in_stack_ffffffffffffff37) {
          auVar3 = llvm::Value::getName();
          auVar4 = auVar3;
          llvm::StringRef::StringRef
                    ((StringRef *)
                     CONCAT17(in_stack_ffffffffffffff37,
                              CONCAT16(in_stack_ffffffffffffff1e,in_stack_ffffffffffffff30)),
                     auVar3._0_8_);
          in_stack_ffffffffffffff58 = auVar4._8_8_;
          LHS.Length = auVar4._0_8_;
          LHS.Data = in_stack_ffffffffffffff48;
          RHS.Length = (size_t)in_stack_ffffffffffffff40;
          RHS.Data = (char *)in_stack_ffffffffffffff38;
          in_stack_ffffffffffffff1f = llvm::operator!=(LHS,RHS);
          in_stack_ffffffffffffff1e = in_stack_ffffffffffffff1f;
        }
        in_stack_ffffffffffffff36 = in_stack_ffffffffffffff1e;
        std::__cxx11::string::~string(local_60);
        std::__cxx11::string::~string((string *)local_80);
        if (((in_stack_ffffffffffffff1e & 1) != 0) &&
           (bVar1 = Program::isFunctionDeclared(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38)
           , !bVar1)) {
          declareFunc(in_stack_00000210,in_stack_00000208);
        }
      }
      uVar2 = llvm::GlobalValue::isDeclaration();
      if (((uVar2 & 1) == 0) &&
         (bVar1 = Program::isFunctionDeclared(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38),
         !bVar1)) {
        declareFunc(in_stack_00000210,in_stack_00000208);
      }
    }
    llvm::
    ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_true>
    ::operator++(auVar3._8_8_);
  } while( true );
}

Assistant:

void findDeclaredFunctions(const llvm::Module *module, Program& program) {
    for(const llvm::Function& func : module->functions()) {
        if (func.hasName()) {
            if (func.isDeclaration() || llvm::Function::isInternalLinkage(func.getLinkage())) {
                if (func.getName().str().substr(0, 8) != "llvm.dbg" && func.getName() != "isnan") {
                    if (!program.isFunctionDeclared(&func)) {
                        declareFunc(&func, program);
                    }
                }
            }

            if (!func.isDeclaration()) {
                if (!program.isFunctionDeclared(&func)) {
                    declareFunc(&func, program);
                }
            }
        }
    }

    program.addPass(PassType::FindDeclaredFunctions);
}